

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O0

bool duckdb::DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
               (DecimalCastData<duckdb::hugeint_t> *state,uint8_t digit)

{
  bool bVar1;
  char in_SIL;
  hugeint_t *in_RDI;
  hugeint_t hVar2;
  hugeint_t *this;
  hugeint_t *this_00;
  hugeint_t *value;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar3;
  hugeint_t *in_stack_ffffffffffffff68;
  hugeint_t *in_stack_ffffffffffffff70;
  uint64_t local_68;
  int64_t local_60;
  bool local_1;
  
  value = in_RDI;
  hugeint_t::hugeint_t
            ((hugeint_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (int64_t)in_RDI);
  bVar1 = hugeint_t::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar3 = bVar1 && in_SIL == '\0';
  if ((bool)uVar3) {
    local_1 = true;
  }
  else if ((uint)*(byte *)((long)&in_RDI[1].lower + 2) ==
           (uint)(byte)in_RDI[1].lower - (uint)*(byte *)((long)&in_RDI[1].lower + 1)) {
    local_1 = false;
  }
  else {
    *(char *)((long)&in_RDI[1].lower + 2) = *(char *)((long)&in_RDI[1].lower + 2) + '\x01';
    this_00 = in_RDI;
    NumericLimits<duckdb::hugeint_t>::Maximum();
    hugeint_t::hugeint_t((hugeint_t *)CONCAT17(uVar3,in_stack_ffffffffffffff60),(int64_t)value);
    hugeint_t::operator/(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    bVar1 = hugeint_t::operator>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      local_1 = false;
    }
    else {
      this = in_RDI;
      hugeint_t::hugeint_t((hugeint_t *)CONCAT17(uVar3,in_stack_ffffffffffffff60),(int64_t)value);
      hugeint_t::operator*(this,(hugeint_t *)0x36b181);
      hugeint_t::hugeint_t((hugeint_t *)CONCAT17(uVar3,in_stack_ffffffffffffff60),(int64_t)value);
      hVar2 = hugeint_t::operator+(this_00,this);
      local_68 = hVar2.lower;
      in_RDI->lower = local_68;
      local_60 = hVar2.upper;
      in_RDI->upper = local_60;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (state.result == 0 && digit == 0) {
			// leading zero's don't count towards the digit count
			return true;
		}
		if (state.digit_count == state.width - state.scale) {
			// width of decimal type is exceeded!
			return false;
		}
		state.digit_count++;
		if (NEGATIVE) {
			if (state.result < (NumericLimits<typename T::StoreType>::Minimum() / 10)) {
				return false;
			}
			state.result = state.result * 10 - digit;
		} else {
			if (state.result > (NumericLimits<typename T::StoreType>::Maximum() / 10)) {
				return false;
			}
			state.result = state.result * 10 + digit;
		}
		return true;
	}